

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenerator::Logger::ErrorFile(Logger *this,GenT genType,string *filename,string *message)

{
  string local_80;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string emsg;
  string *message_local;
  string *filename_local;
  GenT genType_local;
  Logger *this_local;
  
  emsg.field_2._8_8_ = message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"  ",&local_49);
  std::allocator<char>::~allocator(&local_49);
  cmQtAutoGen::Quoted(&local_80,filename);
  std::__cxx11::string::operator+=((string *)local_48,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::operator+=((string *)local_48,'\n');
  std::__cxx11::string::operator+=((string *)local_48,(string *)emsg.field_2._8_8_);
  Error(this,genType,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::ErrorFile(GenT genType,
                                          std::string const& filename,
                                          std::string const& message) const
{
  std::string emsg = "  ";
  emsg += Quoted(filename);
  emsg += '\n';
  // Message
  emsg += message;
  Error(genType, emsg);
}